

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O1

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetGlobalCentreOfPressureAtSample
          (VClient *this,uint i_PlateID,uint i_Subsample,double (*o_rLocation) [3])

{
  pointer pVVar1;
  bool bVar2;
  Enum EVar3;
  ulong uVar4;
  Enum EVar5;
  long lVar6;
  uint PlateIndex;
  scoped_lock Lock;
  array<double,_3UL> WorldTranslation;
  array<double,_3UL> LocationVector;
  array<double,_3UL> WorldLocationVector;
  array<double,_9UL> WorldRotation;
  uint local_fc;
  unique_lock<boost::recursive_mutex> local_f8;
  double local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  array<double,_3UL> local_d0;
  array<double,_3UL> local_b8;
  array<double,_3UL> local_a0;
  double local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  array<double,_9UL> local_70;
  
  local_f8.m = &this->m_FrameMutex;
  local_f8.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_f8);
  lVar6 = 0;
  do {
    ClientUtils::Clear((double *)((long)*o_rLocation + lVar6));
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x18);
  EVar3 = GetForcePlateVector<ViconCGStream::VCentreOfPressureFrame>
                    (this,i_PlateID,i_Subsample,&(this->m_LatestFrame).m_CentresOfPressure,&local_a0
                    );
  if (EVar3 == Success) {
    bVar2 = ForcePlateDeviceIndex(this,i_PlateID,&local_fc);
    if (!bVar2) {
      EVar5 = Unknown;
      goto LAB_0012cb26;
    }
    pVVar1 = (this->m_LatestFrame).m_ForcePlates.
             super__Vector_base<ViconCGStream::VForcePlateInfo,_std::allocator<ViconCGStream::VForcePlateInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = 10;
    lVar6 = 0;
    do {
      *(double *)((long)local_70._M_elems + lVar6 * 2) =
           (double)*(float *)((long)pVVar1[local_fc].m_WorldRotation + lVar6);
      uVar4 = uVar4 - 1;
      lVar6 = lVar6 + 4;
    } while (1 < uVar4);
    uVar4 = 4;
    lVar6 = 0;
    do {
      *(double *)((long)local_d0._M_elems + lVar6 * 2) =
           (double)*(float *)((long)pVVar1[local_fc].m_WorldTranslation + lVar6);
      uVar4 = uVar4 - 1;
      lVar6 = lVar6 + 4;
    } while (1 < uVar4);
    ClientUtils::operator/=(&local_d0,1000.0);
    ClientUtils::operator*(&local_b8,&local_70,&local_a0);
    ClientUtils::operator+(&local_b8,&local_d0);
    local_78 = local_d8;
    local_88 = local_e8;
    uStack_80 = uStack_e0;
    CopyAndTransformT(this,&local_88,o_rLocation);
    EVar5 = Unknown;
    if (!bVar2) goto LAB_0012cb26;
  }
  EVar5 = EVar3;
LAB_0012cb26:
  if (local_f8.is_locked == true) {
    boost::recursive_mutex::unlock(local_f8.m);
  }
  return EVar5;
}

Assistant:

Result::Enum VClient::GetGlobalCentreOfPressureAtSample( const unsigned int i_PlateID,
                                                 const unsigned int i_Subsample, 
                                                 double ( & o_rLocation )[3] ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Clear( o_rLocation );

  std::array< double, 3 > LocationVector;
  Result::Enum Result = GetCentreOfPressure( i_PlateID, i_Subsample, LocationVector );

  if( Result == Result::Success )
  {
    unsigned int PlateIndex;
    if( !ForcePlateDeviceIndex( i_PlateID, PlateIndex ) )
    {
      return Result::Unknown;
    }

    const ViconCGStream::VForcePlateInfo & rForcePlate = m_LatestFrame.m_ForcePlates[ PlateIndex ];

    std::array< double, 3 * 3 > WorldRotation;
    std::copy( rForcePlate.m_WorldRotation, rForcePlate.m_WorldRotation + 9, WorldRotation.begin() );

    std::array< double, 3 > WorldTranslation;
    std::copy( rForcePlate.m_WorldTranslation, rForcePlate.m_WorldTranslation + 3, WorldTranslation.begin() );

    // Force Plate Info is in mm.  Result CoP is in meters.
    WorldTranslation /= 1000.0;

    std::array< double, 3 > WorldLocationVector;

    WorldLocationVector = WorldRotation * LocationVector + WorldTranslation;

    CopyAndTransformT( WorldLocationVector.data(), o_rLocation );
  }

  return Result;
}